

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_shift.c
# Opt level: O0

int BN_lshift1(BIGNUM *r,BIGNUM *a)

{
  ulong uVar1;
  BIGNUM *pBVar2;
  int i;
  unsigned_long c;
  unsigned_long t;
  unsigned_long *rp;
  unsigned_long *ap;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar3;
  ulong local_38;
  ulong *local_28;
  ulong *local_20;
  
  if (r == a) {
    pBVar2 = bn_wexpand((BIGNUM *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffbc);
    if (pBVar2 == (BIGNUM *)0x0) {
      return 0;
    }
  }
  else {
    r->neg = a->neg;
    pBVar2 = bn_wexpand((BIGNUM *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffbc);
    if (pBVar2 == (BIGNUM *)0x0) {
      return 0;
    }
    r->top = a->top;
  }
  local_38 = 0;
  local_28 = r->d;
  local_20 = a->d;
  for (iVar3 = 0; iVar3 < a->top; iVar3 = iVar3 + 1) {
    uVar1 = *local_20;
    *local_28 = uVar1 << 1 | local_38;
    local_38 = (ulong)(int)(uint)((uVar1 & 0x8000000000000000) != 0);
    local_28 = local_28 + 1;
    local_20 = local_20 + 1;
  }
  if (local_38 != 0) {
    *local_28 = 1;
    r->top = r->top + 1;
  }
  return 1;
}

Assistant:

int BN_lshift1(BIGNUM *r, const BIGNUM *a)
{
    register BN_ULONG *ap, *rp, t, c;
    int i;

    bn_check_top(r);
    bn_check_top(a);

    if (r != a) {
        r->neg = a->neg;
        if (bn_wexpand(r, a->top + 1) == NULL)
            return (0);
        r->top = a->top;
    } else {
        if (bn_wexpand(r, a->top + 1) == NULL)
            return (0);
    }
    ap = a->d;
    rp = r->d;
    c = 0;
    for (i = 0; i < a->top; i++) {
        t = *(ap++);
        *(rp++) = ((t << 1) | c) & BN_MASK2;
        c = (t & BN_TBIT) ? 1 : 0;
    }
    if (c) {
        *rp = 1;
        r->top++;
    }
    bn_check_top(r);
    return (1);
}